

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<long_long,_QList<QString>_> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<long_long,_QList<QString>_>_>::findNode<long_long>
          (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *this,longlong *key)

{
  byte bVar1;
  Node<long_long,_QList<QString>_> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<long_long>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<long_long,_QList<QString>_> *)0x0;
  }
  else {
    pNVar2 = (Node<long_long,_QList<QString>_> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }